

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall PythonModuleClient::recv_quit(PythonModuleClient *this)

{
  bool_type bVar1;
  AbstractModuleClient *in_RDI;
  error_already_set *anon_var_0;
  override recv_quit;
  PyLockGIL lock;
  object_operators<boost::python::api::object> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffd0;
  wrapper<AbstractModuleClient> *in_stack_ffffffffffffffd8;
  
  PyLockGIL::PyLockGIL((PyLockGIL *)in_stack_ffffffffffffffb0);
  boost::python::wrapper<AbstractModuleClient>::get_override
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer
                    (in_stack_ffffffffffffffb0);
  if (bVar1 != 0) {
    boost::python::override::operator()((override *)in_RDI);
    boost::python::detail::method_result::~method_result((method_result *)0x3e6327);
  }
  boost::python::override::~override((override *)0x3e63d5);
  if (bVar1 == 0) {
    AbstractModuleClient::recv_quit(in_RDI);
  }
  PyLockGIL::~PyLockGIL((PyLockGIL *)0x3e63fb);
  return;
}

Assistant:

void recv_quit(){
        PyLockGIL lock;
        if(override recv_quit = this->get_override("recv_quit")){
            try{
                recv_quit();
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_quit in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_quit();
    }